

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolrpaintgraphrenderer.cpp
# Opt level: O2

void __thiscall
QColrPaintGraphRenderer::setRadialGradient
          (QColrPaintGraphRenderer *this,QPointF c0,qreal r0,QPointF c1,qreal r1,Spread spread,
          QGradientStops *gradientStops)

{
  QTransform *this_00;
  undefined8 uVar1;
  QPainter *this_01;
  QLoggingCategory *pQVar2;
  QByteArray *t;
  QDebug *pQVar3;
  long lVar4;
  undefined8 *puVar5;
  QGradient *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  float fVar8;
  float fVar9;
  qreal qVar10;
  qreal qVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 local_128;
  undefined4 uStack_124;
  QRadialGradient gradient;
  QPointF local_b8;
  QArrayDataPointer<char> local_a8;
  QBrush local_88;
  undefined1 local_80 [16];
  QDebug local_70;
  QPointF local_68;
  QPointF local_58;
  QDebug local_48;
  QDebug local_40;
  long local_38;
  
  qVar11 = c0.yp;
  qVar10 = c0.xp;
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = c1;
  local_58 = c0;
  if (this->m_painter != (QPainter *)0x0) {
    pQVar2 = QtPrivateLogging::lcColrv1();
    if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) {
      local_128 = c1.xp._0_4_;
      uStack_124 = c1.xp._4_4_;
      uVar12 = c1.yp._0_4_;
      uVar13 = c1.yp._4_4_;
    }
    else {
      gradient.super_QGradient.m_stops.d.size = (qsizetype)pQVar2->name;
      gradient.super_QGradient.m_type = ConicalGradient;
      gradient.super_QGradient._4_8_ = 0;
      gradient.super_QGradient.m_stops.d._4_8_ = 0;
      gradient.super_QGradient.m_stops.d.ptr._4_4_ = 0;
      QMessageLogger::debug();
      *(undefined2 *)
       ((long)local_88.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
              super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
              super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 0x30) = 0x100;
      local_a8.size = 0;
      local_a8._0_16_ = ZEXT816(0);
      t = (QByteArray *)QByteArray::fill((char)&local_a8,0x20);
      pQVar3 = QDebug::operator<<((QDebug *)&local_88,t);
      pQVar3 = QDebug::operator<<(pQVar3,"[radial gradient ");
      local_80._0_8_ = pQVar3->stream;
      ((Stream *)local_80._0_8_)->ref = ((Stream *)local_80._0_8_)->ref + 1;
      ::operator<<((QDebug *)&local_48,(QPointF *)local_80);
      pQVar3 = QDebug::operator<<(&local_48,", rad=");
      pQVar3 = QDebug::operator<<(pQVar3,r0);
      pQVar3 = QDebug::operator<<(pQVar3,", ");
      local_80._8_8_ = pQVar3->stream;
      ((Stream *)local_80._8_8_)->ref = ((Stream *)local_80._8_8_)->ref + 1;
      ::operator<<((QDebug *)&local_40,(QPointF *)(local_80 + 8));
      pQVar3 = QDebug::operator<<(&local_40,", rad=");
      pQVar3 = QDebug::operator<<(pQVar3,r1);
      pQVar3 = QDebug::operator<<(pQVar3,", spread: ");
      local_70.stream = pQVar3->stream;
      (local_70.stream)->ref = (local_70.stream)->ref + 1;
      ::operator<<((Stream *)&local_b8,(Spread)&local_70);
      pQVar3 = QDebug::operator<<((QDebug *)&local_b8,", stop count: ");
      pQVar3 = QDebug::operator<<(pQVar3,(gradientStops->d).size);
      QDebug::operator<<(pQVar3,"]");
      QDebug::~QDebug((QDebug *)&local_b8);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_40);
      QDebug::~QDebug((QDebug *)(local_80 + 8));
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug((QDebug *)local_80);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
      QDebug::~QDebug((QDebug *)&local_88);
      local_128 = local_68.xp._0_4_;
      uStack_124 = local_68.xp._4_4_;
      uVar12 = local_68.yp._0_4_;
      uVar13 = local_68.yp._4_4_;
      qVar10 = local_58.xp;
      qVar11 = local_58.yp;
    }
    local_a8.ptr = (char *)(qVar11 + 0.0);
    local_a8.d = (Data *)(r0 + qVar10);
    local_b8.yp = (double)CONCAT44(uVar13,uVar12) + 0.0;
    local_b8.xp = r1 + (double)CONCAT44(uStack_124,local_128);
    this_00 = &this->m_currentTransform;
    local_58 = QTransform::map(this_00,&local_58);
    local_a8._0_16_ = QTransform::map(this_00,(QPointF *)&local_a8);
    local_68 = QTransform::map(this_00,&local_68);
    local_b8 = QTransform::map(this_00,&local_b8);
    local_40.stream =
         (Stream *)
         CONCAT44((float)((double)local_a8.ptr - local_58.yp),
                  (float)((double)local_a8.d - local_58.xp));
    local_48.stream =
         (Stream *)CONCAT44((float)(local_b8.yp - local_68.yp),(float)(local_b8.xp - local_68.xp));
    puVar5 = &DAT_005f4c28;
    pQVar6 = &gradient.super_QGradient;
    for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *puVar5;
      pQVar6->m_type = (int)uVar1;
      pQVar6->m_spread = (int)((ulong)uVar1 >> 0x20);
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      pQVar6 = (QGradient *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    fVar8 = QVector2D::length((QVector2D *)&local_48);
    fVar9 = QVector2D::length((QVector2D *)&local_40);
    QRadialGradient::QRadialGradient
              ((QRadialGradient *)&gradient.super_QGradient,&local_68,(double)fVar8,&local_58,
               (double)fVar9);
    QGradient::setCoordinateMode(&gradient.super_QGradient,LogicalMode);
    gradient.super_QGradient.m_spread = spread;
    QGradient::setStops(&gradient.super_QGradient,gradientStops);
    this_01 = this->m_painter;
    QBrush::QBrush(&local_88,&gradient.super_QGradient);
    QPainter::setBrush(this_01,&local_88);
    QBrush::~QBrush(&local_88);
    QRadialGradient::~QRadialGradient((QRadialGradient *)&gradient.super_QGradient);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColrPaintGraphRenderer::setRadialGradient(QPointF c0, qreal r0,
                                                QPointF c1, qreal r1,
                                                QGradient::Spread spread,
                                                const QGradientStops &gradientStops)
{
    if (m_painter != nullptr) {
        qCDebug(lcColrv1).noquote().nospace()
            << QByteArray().fill(' ', m_oldPaths.size() * 2)
            << "[radial gradient " << c0
            << ", rad=" << r0
            << ", " << c1
            << ", rad=" << r1
            << ", spread: " << spread
            << ", stop count: " << gradientStops.size()
            << "]";

        QPointF c0e(c0 + QPointF(r0, 0.0));
        QPointF c1e(c1 + QPointF(r1, 0.0));

        c0 = m_currentTransform.map(c0);
        c0e = m_currentTransform.map(c0e);
        c1 = m_currentTransform.map(c1);
        c1e = m_currentTransform.map(c1e);

        const QVector2D d0(c0e - c0);
        const QVector2D d1(c1e - c1);

        QRadialGradient gradient(c1, d1.length(), c0, d0.length());
        gradient.setCoordinateMode(QGradient::LogicalMode);
        gradient.setSpread(spread);
        gradient.setStops(gradientStops);
        m_painter->setBrush(gradient);
    }
}